

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  char *pcVar4;
  reference ppcVar5;
  cmake *this_00;
  cmGlobalGenerator *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  value_type local_7d0;
  value_type local_7a8;
  value_type local_728;
  value_type local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6b0;
  allocator local_661;
  string local_660;
  char *local_640;
  char *labelsForSubprojects;
  string local_630;
  char *local_610;
  char *useLaunchers;
  ostringstream local_5e8 [8];
  ostringstream ostr;
  string local_470 [32];
  undefined1 local_450 [8];
  ostringstream cmCTestLog_msg;
  allocator local_2d1;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  allocator local_281;
  string local_280;
  undefined1 local_260 [8];
  string buildCommand;
  string local_238;
  undefined1 local_218 [8];
  string dir;
  char *config;
  undefined1 local_1e8 [8];
  string e;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  byte local_17b;
  byte local_17a;
  allocator local_179;
  string local_178;
  value_type local_158;
  char *cmakeBuildTarget;
  string local_148;
  value_type local_128;
  char *cmakeBuildAdditionalFlags;
  char *cmakeBuildConfiguration;
  string local_110;
  char *local_f0;
  char *ctestBuildConfiguration;
  string local_e0;
  char *local_c0;
  char *cmakeProjectName;
  string local_b0;
  char *local_90;
  char *cmakeGeneratorName;
  string local_80;
  char *local_60;
  char *ctestBuildCommand;
  allocator local_41;
  string local_40;
  cmCTestBuildHandler *local_20;
  cmCTestGenericHandler *handler;
  cmCTestBuildCommand *this_local;
  
  handler = (cmCTestGenericHandler *)this;
  local_20 = (cmCTestBuildHandler *)
             cmCTest::GetInitializedHandler
                       ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"build");
  if (local_20 == (cmCTestBuildHandler *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"internal CTest error. Cannot instantiate build handler",
               &local_41);
    cmCommand::SetError((cmCommand *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local = (cmCTestBuildCommand *)0x0;
  }
  else {
    this->Handler = local_20;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_80,"CTEST_BUILD_COMMAND",
               (allocator *)((long)&cmakeGeneratorName + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeGeneratorName + 7));
    local_60 = pcVar4;
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b0,"CTEST_CMAKE_GENERATOR",
                 (allocator *)((long)&cmakeProjectName + 7));
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeProjectName + 7));
      local_90 = pcVar4;
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,0xc);
      ctestBuildConfiguration._6_1_ = 0;
      ctestBuildConfiguration._5_1_ = 0;
      if ((*ppcVar5 == (value_type)0x0) ||
         (ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&(this->super_cmCTestHandlerCommand).Values,0xc), **ppcVar5 == '\0'))
      {
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        ctestBuildConfiguration._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_e0,"CTEST_PROJECT_NAME",
                   (allocator *)((long)&ctestBuildConfiguration + 7));
        ctestBuildConfiguration._5_1_ = 1;
        local_6b0 = cmMakefile::GetDefinition(pcVar1,&local_e0);
      }
      else {
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&(this->super_cmCTestHandlerCommand).Values,0xc);
        local_6b0 = *ppcVar5;
      }
      if ((ctestBuildConfiguration._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_e0);
      }
      if ((ctestBuildConfiguration._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&ctestBuildConfiguration + 7));
      }
      local_c0 = local_6b0;
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_110,"CTEST_BUILD_CONFIGURATION",
                 (allocator *)((long)&cmakeBuildConfiguration + 7));
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeBuildConfiguration + 7));
      local_f0 = pcVar4;
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,10);
      if ((*ppcVar5 == (value_type)0x0) ||
         (ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&(this->super_cmCTestHandlerCommand).Values,10), **ppcVar5 == '\0'))
      {
        if ((local_f0 == (char *)0x0) || (*local_f0 == '\0')) {
          cmCTest::GetConfigType_abi_cxx11_
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
          local_6f8 = (char *)std::__cxx11::string::c_str();
        }
        else {
          local_6f8 = local_f0;
        }
        local_6f0 = local_6f8;
      }
      else {
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&(this->super_cmCTestHandlerCommand).Values,10);
        local_6f0 = *ppcVar5;
      }
      cmakeBuildAdditionalFlags = local_6f0;
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,0xb);
      cmakeBuildTarget._6_1_ = 0;
      cmakeBuildTarget._5_1_ = 0;
      if ((*ppcVar5 == (value_type)0x0) ||
         (ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&(this->super_cmCTestHandlerCommand).Values,0xb), **ppcVar5 == '\0'))
      {
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        cmakeBuildTarget._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_148,"CTEST_BUILD_FLAGS",
                   (allocator *)((long)&cmakeBuildTarget + 7));
        cmakeBuildTarget._5_1_ = 1;
        local_700 = cmMakefile::GetDefinition(pcVar1,&local_148);
      }
      else {
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&(this->super_cmCTestHandlerCommand).Values,0xb);
        local_700 = *ppcVar5;
      }
      if ((cmakeBuildTarget._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_148);
      }
      if ((cmakeBuildTarget._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeBuildTarget + 7));
      }
      local_128 = local_700;
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,9);
      local_17a = 0;
      local_17b = 0;
      if ((*ppcVar5 == (value_type)0x0) ||
         (ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&(this->super_cmCTestHandlerCommand).Values,9), **ppcVar5 == '\0')) {
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        local_17a = 1;
        std::__cxx11::string::string((string *)&local_178,"CTEST_BUILD_TARGET",&local_179);
        local_17b = 1;
        local_728 = cmMakefile::GetDefinition(pcVar1,&local_178);
      }
      else {
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&(this->super_cmCTestHandlerCommand).Values,9);
        local_728 = *ppcVar5;
      }
      if ((local_17b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_178);
      }
      if ((local_17a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
      }
      local_158 = local_728;
      if ((((local_90 == (char *)0x0) || (*local_90 == '\0')) || (local_c0 == (char *)0x0)) ||
         (*local_c0 == '\0')) {
        std::__cxx11::ostringstream::ostringstream(local_5e8);
        std::operator<<((ostream *)local_5e8,
                        "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR and CTEST_PROJECT_NAME are set.\nCTEST_PROJECT_NAME is usually set in CTestConfig.cmake. Verify that CTestConfig.cmake exists, or CTEST_PROJECT_NAME is set in the script, or PROJECT_NAME is passed as an argument to ctest_build.\nAlternatively, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                       );
        std::__cxx11::ostringstream::str();
        cmCommand::SetError((cmCommand *)this,(string *)&useLaunchers);
        std::__cxx11::string::~string((string *)&useLaunchers);
        this_local = (cmCTestBuildCommand *)0x0;
        std::__cxx11::ostringstream::~ostringstream(local_5e8);
        return (cmCTestGenericHandler *)this_local;
      }
      if (cmakeBuildAdditionalFlags == (char *)0x0) {
        cmakeBuildAdditionalFlags = "Release";
      }
      if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])();
        bVar3 = std::operator!=(&local_1a0,local_90);
        std::__cxx11::string::~string((string *)&local_1a0);
        if (bVar3) {
          if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
            (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
          }
          this->GlobalGenerator = (cmGlobalGenerator *)0x0;
        }
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        this_00 = cmMakefile::GetCMakeInstance
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                             super_cmCommand.Makefile);
        pcVar4 = local_90;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1c0,pcVar4,(allocator *)(e.field_2._M_local_buf + 0xf));
        pcVar6 = cmake::CreateGlobalGenerator(this_00,&local_1c0);
        this->GlobalGenerator = pcVar6;
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
        if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_1e8,"could not create generator named \"",
                     (allocator *)((long)&config + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&config + 7));
          std::__cxx11::string::operator+=((string *)local_1e8,local_90);
          std::__cxx11::string::operator+=((string *)local_1e8,"\"");
          cmMakefile::IssueMessage
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                     Makefile,FATAL_ERROR,(string *)local_1e8);
          cmSystemTools::SetFatalErrorOccured();
          this_local = (cmCTestBuildCommand *)0x0;
          std::__cxx11::string::~string((string *)local_1e8);
          return (cmCTestGenericHandler *)this_local;
        }
      }
      sVar7 = strlen(cmakeBuildAdditionalFlags);
      if (sVar7 == 0) {
        dir.field_2._8_8_ = (long)"/Debug" + 1;
        cmakeBuildAdditionalFlags = "Debug";
      }
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_238,"BuildDirectory",
                 (allocator *)(buildCommand.field_2._M_local_buf + 0xf));
      cmCTest::GetCTestConfiguration((string *)local_218,pcVar2,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator((allocator<char> *)(buildCommand.field_2._M_local_buf + 0xf))
      ;
      pcVar6 = this->GlobalGenerator;
      if (local_158 == (value_type)0x0) {
        local_7a8 = "";
      }
      else {
        local_7a8 = local_158;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_280,local_7a8,&local_281);
      pcVar4 = cmakeBuildAdditionalFlags;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2a8,pcVar4,&local_2a9);
      if (local_128 == (value_type)0x0) {
        local_7d0 = "";
      }
      else {
        local_7d0 = local_128;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2d0,local_7d0,&local_2d1);
      bVar3 = cmMakefile::IgnoreErrorsCMP0061
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                         Makefile);
      cmGlobalGenerator::GenerateCMakeBuildCommand
                ((string *)local_260,pcVar6,&local_280,&local_2a8,&local_2d0,bVar3);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
      poVar8 = std::operator<<((ostream *)local_450,"SetMakeCommand:");
      poVar8 = std::operator<<(poVar8,(string *)local_260);
      std::operator<<(poVar8,"\n");
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
                   ,0x7f,pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
      std::__cxx11::string::~string(local_470);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::SetCTestConfiguration
                (pcVar2,"MakeCommand",pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
      std::__cxx11::string::~string((string *)local_260);
      std::__cxx11::string::~string((string *)local_218);
    }
    else {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",pcVar4
                 ,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_630,"CTEST_USE_LAUNCHERS",
               (allocator *)((long)&labelsForSubprojects + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator((allocator<char> *)((long)&labelsForSubprojects + 7));
    local_610 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
                 pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_660,"CTEST_LABELS_FOR_SUBPROJECTS",&local_661);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_660);
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    local_640 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                 "LabelsForSubprojects",pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1)
                );
    }
    cmCTestGenericHandler::SetQuiet
              (&local_20->super_cmCTestGenericHandler,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    this_local = (cmCTestBuildCommand *)local_20;
  }
  return (cmCTestGenericHandler *)this_local;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestGenericHandler* handler = this->CTest->GetInitializedHandler("build");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate build handler");
    return CM_NULLPTR;
  }
  this->Handler = (cmCTestBuildHandler*)handler;

  const char* ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (ctestBuildCommand && *ctestBuildCommand) {
    this->CTest->SetCTestConfiguration("MakeCommand", ctestBuildCommand,
                                       this->Quiet);
  } else {
    const char* cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    const char* cmakeProjectName =
      (this->Values[ctb_PROJECT_NAME] && *this->Values[ctb_PROJECT_NAME])
      ? this->Values[ctb_PROJECT_NAME]
      : this->Makefile->GetDefinition("CTEST_PROJECT_NAME");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    const char* ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    const char* cmakeBuildConfiguration =
      (this->Values[ctb_CONFIGURATION] && *this->Values[ctb_CONFIGURATION])
      ? this->Values[ctb_CONFIGURATION]
      : ((ctestBuildConfiguration && *ctestBuildConfiguration)
           ? ctestBuildConfiguration
           : this->CTest->GetConfigType().c_str());

    const char* cmakeBuildAdditionalFlags =
      (this->Values[ctb_FLAGS] && *this->Values[ctb_FLAGS])
      ? this->Values[ctb_FLAGS]
      : this->Makefile->GetDefinition("CTEST_BUILD_FLAGS");
    const char* cmakeBuildTarget =
      (this->Values[ctb_TARGET] && *this->Values[ctb_TARGET])
      ? this->Values[ctb_TARGET]
      : this->Makefile->GetDefinition("CTEST_BUILD_TARGET");

    if (cmakeGeneratorName && *cmakeGeneratorName && cmakeProjectName &&
        *cmakeProjectName) {
      if (!cmakeBuildConfiguration) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != cmakeGeneratorName) {
          delete this->GlobalGenerator;
          this->GlobalGenerator = CM_NULLPTR;
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = "could not create generator named \"";
          e += cmakeGeneratorName;
          e += "\"";
          this->Makefile->IssueMessage(cmake::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccured();
          return CM_NULLPTR;
        }
      }
      if (strlen(cmakeBuildConfiguration) == 0) {
        const char* config = CM_NULLPTR;
#ifdef CMAKE_INTDIR
        config = CMAKE_INTDIR;
#endif
        if (!config) {
          config = "Debug";
        }
        cmakeBuildConfiguration = config;
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget ? cmakeBuildTarget : "", cmakeBuildConfiguration,
          cmakeBuildAdditionalFlags ? cmakeBuildAdditionalFlags : "",
          this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand.c_str(),
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "and CTEST_PROJECT_NAME are set."
        "\n"
        "CTEST_PROJECT_NAME is usually set in CTestConfig.cmake. Verify "
        "that CTestConfig.cmake exists, or CTEST_PROJECT_NAME "
        "is set in the script, or PROJECT_NAME is passed as an argument "
        "to ctest_build."
        "\n"
        "Alternatively, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return CM_NULLPTR;
    }
  }

  if (const char* useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", useLaunchers,
                                       this->Quiet);
  }

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}